

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O1

bool __thiscall ON_3dmObjectAttributes::Read(ON_3dmObjectAttributes *this,ON_BinaryArchive *file)

{
  ON_SimpleArray<ON_DisplayMaterialRef> *a;
  undefined4 uVar1;
  undefined4 uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  object_decoration oVar9;
  object_color_source oVar10;
  object_linetype_source oVar11;
  object_material_source oVar12;
  object_mode oVar13;
  plot_color_source pVar14;
  plot_weight_source pVar15;
  int iVar16;
  wchar_t *candidate_name;
  ON_DisplayMaterialRef *pOVar17;
  int minor_version;
  uchar uc;
  short s;
  ON_wString name;
  int major_version;
  int i;
  int local_54;
  ON__UINT8 local_4d;
  uint local_4c;
  ON_wString local_48;
  int local_40;
  ON__INT32 local_3c;
  ON_UUID *local_38;
  
  Default(this);
  iVar7 = ON_BinaryArchive::Archive3dmVersion(file);
  if ((4 < iVar7) && (uVar8 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), 0xbf69ffd < uVar8)) {
    bVar5 = Internal_ReadV5(this,file);
    return bVar5;
  }
  local_40 = 0;
  local_54 = 0;
  bVar6 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_40,&local_54);
  bVar5 = false;
  if ((bVar6) && (bVar5 = false, local_40 == 1)) {
    bVar5 = ON_BinaryArchive::ReadUuid(file,&this->m_uuid);
    if (bVar5) {
      bVar5 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,Layer,&this->m_layer_index);
    }
    if (bVar5 != false) {
      bVar5 = ON_BinaryArchive::Read3dmReferencedComponentIndex
                        (file,Material,&this->m_material_index);
    }
    if (bVar5 != false) {
      bVar5 = ON_BinaryArchive::ReadColor(file,&this->m_color);
    }
    if (bVar5 != false) {
      local_4c = local_4c & 0xffff0000;
      bVar5 = ON_BinaryArchive::ReadShort(file,(ON__INT16 *)&local_4c);
      if (bVar5) {
        iVar7 = ON_BinaryArchive::Archive3dmVersion(file);
        if ((iVar7 < 4) ||
           (uVar8 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), uVar8 < 0xbf36f82)) {
          oVar9 = ON::ObjectDecoration(local_4c & 0x18);
          this->m_object_decoration = oVar9;
        }
        bVar5 = ON_BinaryArchive::ReadShort(file,(ON__INT16 *)&local_4c);
        if ((bVar5) && (bVar5 = ON_BinaryArchive::ReadDouble(file,(double *)&local_48), bVar5)) {
          bVar5 = ON_BinaryArchive::ReadDouble(file,(double *)&local_48);
        }
      }
    }
    if (bVar5 != false) {
      bVar5 = ON_BinaryArchive::ReadInt(file,&this->m_wire_density);
    }
    if (bVar5 != false) {
      bVar5 = ON_BinaryArchive::ReadChar(file,&this->m_mode);
    }
    if (bVar5 != false) {
      bVar5 = ON_BinaryArchive::ReadChar(file,&this->m_color_source);
    }
    if (bVar5 != false) {
      oVar10 = ON::ObjectColorSource((uint)this->m_color_source);
      this->m_color_source = (uchar)oVar10;
      bVar5 = ON_BinaryArchive::ReadChar(file,&this->m_linetype_source);
    }
    if (bVar5 != false) {
      oVar11 = ON::ObjectLinetypeSource((uint)this->m_linetype_source);
      this->m_linetype_source = (uchar)oVar11;
      bVar5 = ON_BinaryArchive::ReadChar(file,&this->m_material_source);
    }
    if (bVar5 == false) {
      ON_wString::ON_wString(&local_48);
      bVar5 = false;
    }
    else {
      oVar12 = ON::ObjectMaterialSource((uint)this->m_material_source);
      this->m_material_source = (uchar)oVar12;
      ON_wString::ON_wString(&local_48);
      bVar5 = ON_BinaryArchive::ReadString(file,&local_48);
    }
    if (bVar5 != false) {
      candidate_name = ON_wString::operator_cast_to_wchar_t_(&local_48);
      SetName(this,candidate_name,true);
      if (bVar5 != false) {
        bVar5 = ON_BinaryArchive::ReadString(file,&this->m_url);
      }
    }
    oVar13 = ON::ObjectMode(this->m_mode & 0xf);
    this->m_bVisible = oVar13 != hidden_object;
    if ((((0 < local_54 & bVar5) == 1) &&
        (bVar5 = ON_BinaryArchive::Read3dmReferencedComponentIndexArray(file,Group,&this->m_group),
        1 < local_54 && bVar5)) &&
       (bVar5 = ON_BinaryArchive::ReadBool(file,&this->m_bVisible), 2 < local_54 && bVar5)) {
      a = &this->m_dmref;
      bVar5 = ON_BinaryArchive::ReadArray(file,a);
      if (3 < local_54 && bVar5) {
        local_3c = 0;
        bVar5 = ON_BinaryArchive::ReadInt(file,&local_3c);
        if (bVar5) {
          oVar9 = ON::ObjectDecoration(local_3c);
          this->m_object_decoration = oVar9;
          if (bVar5) {
            bVar5 = ON_BinaryArchive::ReadChar(file,&this->m_plot_color_source);
          }
        }
        if (bVar5 != false) {
          pVar14 = ON::PlotColorSource((uint)this->m_plot_color_source);
          this->m_plot_color_source = (uchar)pVar14;
          if (bVar5 != false) {
            bVar5 = ON_BinaryArchive::ReadColor(file,&this->m_plot_color);
          }
        }
        if (bVar5 != false) {
          bVar5 = ON_BinaryArchive::ReadChar(file,&this->m_plot_weight_source);
        }
        if (bVar5 != false) {
          pVar15 = ON::PlotWeightSource((uint)this->m_plot_weight_source);
          this->m_plot_weight_source = (uchar)pVar15;
          if (bVar5 != false) {
            bVar5 = ON_BinaryArchive::ReadDouble(file,&this->m_plot_weight_mm);
          }
        }
        if (((bVar5 != false) && (4 < local_54)) &&
           (bVar5 = ON_BinaryArchive::Read3dmReferencedComponentIndex
                              (file,LinePattern,&this->m_linetype_index), 5 < local_54 && bVar5)) {
          local_4d = '\0';
          bVar5 = ON_BinaryArchive::ReadChar(file,&local_4d);
          if (bVar5) {
            this->m_space = (local_4d == '\x01') + model_space;
            pOVar17 = (this->m_dmref).m_a;
            if (pOVar17 != (ON_DisplayMaterialRef *)0x0) {
              memset(pOVar17,0,(long)(this->m_dmref).m_capacity << 5);
            }
            (this->m_dmref).m_count = 0;
            local_4c = 0;
            bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_4c);
            if (0 < (int)local_4c && bVar5) {
              ON_SimpleArray<ON_DisplayMaterialRef>::SetCapacity(a,(ulong)local_4c);
              if (bVar5 && 0 < (int)local_4c) {
                local_38 = &this->m_viewport_id;
                iVar7 = 1;
                do {
                  pOVar17 = ON_SimpleArray<ON_DisplayMaterialRef>::AppendNew(a);
                  bVar5 = ON_BinaryArchive::ReadUuid(file,&pOVar17->m_viewport_id);
                  if (bVar5) {
                    bVar5 = ON_BinaryArchive::ReadUuid(file,&pOVar17->m_display_material_id);
                  }
                  if ((bVar5 != false) &&
                     (iVar16 = ON_UuidCompare(&ON_ObsoletePageSpaceObjectId,
                                              &pOVar17->m_display_material_id), iVar16 == 0)) {
                    uVar3 = (pOVar17->m_viewport_id).Data2;
                    uVar4 = (pOVar17->m_viewport_id).Data3;
                    uVar1 = *(undefined4 *)(pOVar17->m_viewport_id).Data4;
                    uVar2 = *(undefined4 *)((pOVar17->m_viewport_id).Data4 + 4);
                    local_38->Data1 = (pOVar17->m_viewport_id).Data1;
                    local_38->Data2 = uVar3;
                    local_38->Data3 = uVar4;
                    *(undefined4 *)local_38->Data4 = uVar1;
                    *(undefined4 *)(local_38->Data4 + 4) = uVar2;
                    (*(this->m_dmref)._vptr_ON_SimpleArray[2])(a);
                  }
                  bVar6 = iVar7 < (int)local_4c;
                  iVar7 = iVar7 + 1;
                } while ((bVar6 & bVar5) != 0);
              }
              if ((this->m_dmref).m_count == 0) {
                ON_SimpleArray<ON_DisplayMaterialRef>::SetCapacity(a,0);
              }
            }
          }
          if ((bVar5 != false) && (6 < local_54)) {
            bVar5 = ON_ObjectRenderingAttributes::Read(&this->m_rendering_attributes,file);
          }
        }
      }
    }
    ON_wString::~ON_wString(&local_48);
  }
  return bVar5;
}

Assistant:

bool ON_3dmObjectAttributes::Read( ON_BinaryArchive& file )
{
  Default();
  if (    file.Archive3dmVersion() >= 5 
       && file.ArchiveOpenNURBSVersion() >= 200712190 )
  {
    return Internal_ReadV5(file);
  }
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 ) 
  {
    if (rc) rc = file.ReadUuid(m_uuid);
    if (rc) rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer,&m_layer_index);
    if (rc) rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::RenderMaterial,&m_material_index);
    if (rc) rc = file.ReadColor(m_color);
    
    while(rc)
    {
      // OBSOLETE if (rc) rc = file.ReadLineStyle(m_line_style); // 23 March 2005 Dale Lear
      // replaced with
      short s = 0;
      double x;
      rc = file.ReadShort(&s); 
      if (!rc) break;
      if ( file.Archive3dmVersion() < 4 || file.ArchiveOpenNURBSVersion() < 200503170 )
      {
        // ignore unused linestyle info in old files
        // This bit keeps the curve arrowheads from V3 showing up
        // in V4.
        m_object_decoration = ON::ObjectDecoration( (s & ON::both_arrowhead) );
      }
      rc = file.ReadShort(&s);
      if (!rc) break;
      rc = file.ReadDouble(&x);
      if (!rc) break;
      rc = file.ReadDouble(&x);
      break;
    }

    if (rc) rc = file.ReadInt(&m_wire_density);
    if (rc) rc = file.ReadChar(&m_mode);

    if (rc) rc = file.ReadChar(&m_color_source);
    if (rc) m_color_source = (unsigned char)ON::ObjectColorSource(m_color_source);

    if (rc) rc = file.ReadChar(&m_linetype_source);
    if (rc) m_linetype_source = (unsigned char)ON::ObjectLinetypeSource(m_linetype_source);

    if (rc) rc = file.ReadChar(&m_material_source);
    if (rc) m_material_source = (unsigned char)ON::ObjectMaterialSource(m_material_source);

    ON_wString name;
    if (rc) rc = file.ReadString(name);
    if (rc)
      SetName(name, true);

    if (rc) rc = file.ReadString(m_url);

    m_bVisible = (Mode() != ON::hidden_object);
    if ( rc && minor_version >= 1 ) 
    {
      rc = file.Read3dmReferencedComponentIndexArray(ON_ModelComponent::Type::Group, m_group);
      if ( rc && minor_version >= 2 )
      {
        rc = file.ReadBool(&m_bVisible);

        if ( rc && minor_version >= 3 )
        {
          rc = file.ReadArray(m_dmref);     

          if (rc && minor_version >= 4 )
          {
            // 23 March 2005 Dale Lear
            //    Added m_plot_color_source and m_plot_color
            i = 0;
            if (rc) rc = file.ReadInt(&i);
            if (rc) m_object_decoration = ON::ObjectDecoration(i);
            if (rc) rc = file.ReadChar(&m_plot_color_source);
            if (rc) m_plot_color_source = (unsigned char)ON::PlotColorSource(m_plot_color_source);
            if (rc) rc = file.ReadColor( m_plot_color );
            if (rc) rc = file.ReadChar(&m_plot_weight_source);
            if (rc) m_plot_weight_source = (unsigned char)ON::PlotWeightSource(m_plot_weight_source);
            if (rc) rc = file.ReadDouble(&m_plot_weight_mm);


            if (rc && minor_version >= 5 )
            {
              // version 1.5 fields 11 April 2005
              if (rc) rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::LinePattern,&m_linetype_index);

              // version 1.6 fields 2 September 2005
              if (rc && minor_version >= 6 )
              {
                unsigned char uc = 0;
                rc = file.ReadChar(&uc);
                if (rc)
                {
                  m_space = (1 == uc) ? ON::page_space : ON::model_space;
                  m_dmref.Empty();
                  int i_local, count=0;
                  rc = file.ReadInt(&count);
                  if (rc && count > 0)
                  {
                    m_dmref.SetCapacity(count);
                    for ( i_local = 0; i_local < count && rc; i_local++)
                    {
                      ON_DisplayMaterialRef& dmr = m_dmref.AppendNew();
                      rc = file.ReadUuid(dmr.m_viewport_id);
                      if (rc) rc = file.ReadUuid(dmr.m_display_material_id);
                      if ( rc )
                      {
                        // Assigning an object to a page started out as
                        // using dmrs.  The way the runtime info is saved
                        // has changed, but, at this point, I can't change
                        // the way the information is saved in the file and
                        // it doesn't matter.
                        if ( 0 == ON_UuidCompare(&ON_ObsoletePageSpaceObjectId,&dmr.m_display_material_id) )
                        {
                          m_viewport_id = dmr.m_viewport_id;
                          m_dmref.Remove();
                        }
                      }
                    }
                    if ( 0 == m_dmref.Count() )
                      m_dmref.Destroy();
                  }
                }

                if ( rc && minor_version >= 7 )
                {
                  // version 1.7 fields 6 June 2006
                  if (rc) rc = m_rendering_attributes.Read(file);
                }
              }
            }
          }
        }
      }
    }
  }
  else 
  {
    rc = false;
  }
  return rc;
}